

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4b12d7::LosslessTestLarge::TestLosslessEncoding(LosslessTestLarge *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *message;
  LosslessTestLarge *in_RDI;
  char *file;
  AssertionResult gtest_ar;
  double psnr_lossless;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  aom_rational timebase;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffec4;
  double *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int line;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  uint in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  AssertionResult local_f0;
  char *local_e0;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  TestPartResultReporterInterface in_stack_ffffffffffffff40;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [96];
  undefined8 local_10;
  
  local_10 = 0x3b9aca0001fca055;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
    *)&in_RDI->super_EncoderTest)[4]._M_allocated_capacity = 0x3b9aca0001fca055;
  *(undefined4 *)
   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
     *)&in_RDI->super_EncoderTest + 10) = 2000;
  *(undefined4 *)
   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
     *)&in_RDI->super_EncoderTest + 5) = 0x19;
  *(undefined4 *)((long)&in_RDI->super_EncoderTest + 0xa4) = 0;
  *(undefined4 *)((long)&in_RDI->super_EncoderTest + 0xa8) = 0;
  *(undefined8 *)((long)&in_RDI->super_EncoderTest + 0x3c8) = 0x10000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"hantro_collage_w352h288.yuv",&local_91);
  uVar3 = 5;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_RDI,
             (string *)
             CONCAT17(in_stack_fffffffffffffeef,
                      CONCAT16(in_stack_fffffffffffffeee,
                               CONCAT15(in_stack_fffffffffffffeed,
                                        CONCAT14(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                                                )))),
             (uint)((ulong)in_stack_fffffffffffffee0 >> 0x20),(uint)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,in_stack_ffffffffffffff00,
             in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_RDI);
    in_stack_fffffffffffffeee = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffeee) {
      (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(&in_RDI->super_EncoderTest,local_70);
    }
    in_stack_fffffffffffffeed =
         testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                   ((HasNewFatalFailureHelper *)&stack0xffffffffffffff40);
    if ((bool)in_stack_fffffffffffffeed) {
      in_stack_ffffffffffffff3c = 2;
    }
    else {
      in_stack_ffffffffffffff3c = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffec4,uVar3));
    if (in_stack_ffffffffffffff3c == 0) {
      file = (char *)GetMinPsnr(in_RDI);
      local_e0 = file;
      testing::internal::CmpHelperGE<double,int>
                ((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (int *)CONCAT44(in_stack_fffffffffffffec4,uVar3));
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
      line = CONCAT13(bVar2,(int3)in_stack_fffffffffffffedc);
      if (!bVar2) {
        testing::Message::Message((Message *)in_RDI);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x58e36e);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_RDI,
                   CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffeee,
                                           CONCAT11(in_stack_fffffffffffffeed,
                                                    in_stack_fffffffffffffeec))),file,line,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_ffffffffffffff40._vptr_TestPartResultReporterInterface,
                   (Message *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffec4,uVar3));
        testing::Message::~Message((Message *)0x58e3bc);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x58e408);
      goto LAB_0058e413;
    }
    if (in_stack_ffffffffffffff3c != 2) goto LAB_0058e413;
  }
  testing::Message::Message((Message *)in_RDI);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_RDI,
             CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffeee,
                                     CONCAT11(in_stack_fffffffffffffeed,in_stack_fffffffffffffeec)))
             ,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_ffffffffffffff40._vptr_TestPartResultReporterInterface,
             (Message *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffec4,uVar3));
  testing::Message::~Message((Message *)0x58e289);
LAB_0058e413:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x58e420);
  return;
}

Assistant:

void LosslessTestLarge::TestLosslessEncoding() {
  const aom_rational timebase = { 33333333, 1000000000 };
  cfg_.g_timebase = timebase;
  cfg_.rc_target_bitrate = 2000;
  cfg_.g_lag_in_frames = 25;
  cfg_.rc_min_quantizer = 0;
  cfg_.rc_max_quantizer = 0;

  init_flags_ = AOM_CODEC_USE_PSNR;

  // intentionally changed the dimension for better testing coverage
  libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                     timebase.den, timebase.num, 0, 5);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr_lossless = GetMinPsnr();
  EXPECT_GE(psnr_lossless, kMaxPsnr);
}